

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# YAMLParser.cpp
# Opt level: O3

Node * __thiscall llvm::yaml::KeyValueNode::getValue(KeyValueNode *this)

{
  TokenKind TVar1;
  Scanner *this_00;
  unique_ptr<llvm::yaml::Document,_std::default_delete<llvm::yaml::Document>_> *puVar2;
  char *pcVar3;
  Node *pNVar4;
  Token *pTVar5;
  Document *pDVar6;
  Token TStack_68;
  Twine local_30;
  
  if (this->Value != (Node *)0x0) {
    return this->Value;
  }
  pNVar4 = getKey(this);
  (*pNVar4->_vptr_Node[1])(pNVar4);
  pDVar6 = (((this->super_Node).Doc)->_M_t).
           super___uniq_ptr_impl<llvm::yaml::Document,_std::default_delete<llvm::yaml::Document>_>.
           _M_t.
           super__Tuple_impl<0UL,_llvm::yaml::Document_*,_std::default_delete<llvm::yaml::Document>_>
           .super__Head_base<0UL,_llvm::yaml::Document_*,_false>._M_head_impl;
  this_00 = *(Scanner **)&pDVar6->stream->scanner;
  if (this_00->Failed != true) {
    pTVar5 = Scanner::peekNext(this_00);
    TVar1 = pTVar5->Kind;
    if (TK_Value < TVar1) {
LAB_0018afae:
      Twine::Twine(&local_30,"Unexpected token in Key Value.");
      Scanner::setError(*(Scanner **)
                         &((((this->super_Node).Doc)->_M_t).
                           super___uniq_ptr_impl<llvm::yaml::Document,_std::default_delete<llvm::yaml::Document>_>
                           ._M_t.
                           super__Tuple_impl<0UL,_llvm::yaml::Document_*,_std::default_delete<llvm::yaml::Document>_>
                           .super__Head_base<0UL,_llvm::yaml::Document_*,_false>._M_head_impl)->
                          stream->scanner,&local_30,(pTVar5->Range).Data);
      pNVar4 = (Node *)BumpPtrAllocatorImpl<llvm::MallocAllocator,_4096UL,_4096UL>::Allocate
                                 (&((((this->super_Node).Doc)->_M_t).
                                    super___uniq_ptr_impl<llvm::yaml::Document,_std::default_delete<llvm::yaml::Document>_>
                                    ._M_t.
                                    super__Tuple_impl<0UL,_llvm::yaml::Document_*,_std::default_delete<llvm::yaml::Document>_>
                                    .super__Head_base<0UL,_llvm::yaml::Document_*,_false>.
                                   _M_head_impl)->NodeAllocator,0x48,0x10);
      NullNode::NullNode((NullNode *)pNVar4,(this->super_Node).Doc);
      goto LAB_0018af2e;
    }
    if ((0x18901U >> (TVar1 & (TK_Key|TK_FlowMappingEnd)) & 1) == 0) {
      if (TVar1 != TK_Value) goto LAB_0018afae;
      Scanner::getNext(&TStack_68,
                       *(Scanner **)
                        &((((this->super_Node).Doc)->_M_t).
                          super___uniq_ptr_impl<llvm::yaml::Document,_std::default_delete<llvm::yaml::Document>_>
                          ._M_t.
                          super__Tuple_impl<0UL,_llvm::yaml::Document_*,_std::default_delete<llvm::yaml::Document>_>
                          .super__Head_base<0UL,_llvm::yaml::Document_*,_false>._M_head_impl)->
                         stream->scanner);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)TStack_68.Value._M_dataplus._M_p != &TStack_68.Value.field_2) {
        operator_delete(TStack_68.Value._M_dataplus._M_p,
                        TStack_68.Value.field_2._M_allocated_capacity + 1);
      }
      pTVar5 = Scanner::peekNext(*(Scanner **)
                                  &((((this->super_Node).Doc)->_M_t).
                                    super___uniq_ptr_impl<llvm::yaml::Document,_std::default_delete<llvm::yaml::Document>_>
                                    ._M_t.
                                    super__Tuple_impl<0UL,_llvm::yaml::Document_*,_std::default_delete<llvm::yaml::Document>_>
                                    .super__Head_base<0UL,_llvm::yaml::Document_*,_false>.
                                   _M_head_impl)->stream->scanner);
      if ((pTVar5->Kind != TK_Key) && (pTVar5->Kind != TK_BlockEnd)) {
        pNVar4 = Document::parseBlockNode
                           ((((this->super_Node).Doc)->_M_t).
                            super___uniq_ptr_impl<llvm::yaml::Document,_std::default_delete<llvm::yaml::Document>_>
                            ._M_t.
                            super__Tuple_impl<0UL,_llvm::yaml::Document_*,_std::default_delete<llvm::yaml::Document>_>
                            .super__Head_base<0UL,_llvm::yaml::Document_*,_false>._M_head_impl);
        goto LAB_0018af2e;
      }
    }
    pDVar6 = (((this->super_Node).Doc)->_M_t).
             super___uniq_ptr_impl<llvm::yaml::Document,_std::default_delete<llvm::yaml::Document>_>
             ._M_t.
             super__Tuple_impl<0UL,_llvm::yaml::Document_*,_std::default_delete<llvm::yaml::Document>_>
             .super__Head_base<0UL,_llvm::yaml::Document_*,_false>._M_head_impl;
  }
  pNVar4 = (Node *)BumpPtrAllocatorImpl<llvm::MallocAllocator,_4096UL,_4096UL>::Allocate
                             (&pDVar6->NodeAllocator,0x48,0x10);
  puVar2 = (this->super_Node).Doc;
  pNVar4->Doc = puVar2;
  pNVar4->TypeID = 0;
  (pNVar4->Tag).Data = (char *)0x0;
  (pNVar4->Tag).Length = 0;
  (pNVar4->Anchor).Data = (char *)0x0;
  (pNVar4->Anchor).Length = 0;
  pTVar5 = Scanner::peekNext(*(Scanner **)
                              &((puVar2->_M_t).
                                super___uniq_ptr_impl<llvm::yaml::Document,_std::default_delete<llvm::yaml::Document>_>
                                ._M_t.
                                super__Tuple_impl<0UL,_llvm::yaml::Document_*,_std::default_delete<llvm::yaml::Document>_>
                                .super__Head_base<0UL,_llvm::yaml::Document_*,_false>._M_head_impl)
                               ->stream->scanner);
  pcVar3 = (pTVar5->Range).Data;
  (pNVar4->SourceRange).Start.Ptr = pcVar3;
  (pNVar4->SourceRange).End.Ptr = pcVar3;
  pNVar4->_vptr_Node = (_func_int **)&PTR_anchor_0020d0c0;
LAB_0018af2e:
  this->Value = pNVar4;
  return pNVar4;
}

Assistant:

Node *KeyValueNode::getValue() {
  if (Value)
    return Value;
  getKey()->skip();
  if (failed())
    return Value = new (getAllocator()) NullNode(Doc);

  // Handle implicit null values.
  {
    Token &t = peekNext();
    if (   t.Kind == Token::TK_BlockEnd
        || t.Kind == Token::TK_FlowMappingEnd
        || t.Kind == Token::TK_Key
        || t.Kind == Token::TK_FlowEntry
        || t.Kind == Token::TK_Error) {
      return Value = new (getAllocator()) NullNode(Doc);
    }

    if (t.Kind != Token::TK_Value) {
      setError("Unexpected token in Key Value.", t);
      return Value = new (getAllocator()) NullNode(Doc);
    }
    getNext(); // skip TK_Value.
  }

  // Handle explicit null values.
  Token &t = peekNext();
  if (t.Kind == Token::TK_BlockEnd || t.Kind == Token::TK_Key) {
    return Value = new (getAllocator()) NullNode(Doc);
  }

  // We got a normal value.
  return Value = parseBlockNode();
}